

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ReusableStringStream::~ReusableStringStream(ReusableStringStream *this)

{
  ostream *poVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  allocator local_31;
  string local_30 [32];
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00187348;
  poVar1 = this->m_oss;
  std::__cxx11::string::string(local_30,"",&local_31);
  std::__cxx11::stringbuf::str((string *)(poVar1 + 8));
  std::__cxx11::string::~string(local_30);
  std::ios::clear((int)this->m_oss + (int)*(undefined8 *)(*(long *)this->m_oss + -0x18));
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  StringStreams::release(&pSVar2->super_StringStreams,this->m_index);
  return;
}

Assistant:

ReusableStringStream::~ReusableStringStream() {
        static_cast<std::ostringstream*>( m_oss )->str("");
        m_oss->clear();
        Singleton<StringStreams>::getMutable().release( m_index );
    }